

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseElemExprVarListOpt(WastParser *this,ExprListVector *out_list)

{
  bool bVar1;
  undefined1 local_d0 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_c8;
  Var local_c0;
  undefined1 local_78 [8];
  ExprList init_expr;
  Var var;
  ExprListVector *out_list_local;
  WastParser *this_local;
  
  Var::Var((Var *)&init_expr.size_);
  intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_78);
  while( true ) {
    Var::Var(&local_c0);
    bVar1 = ParseVarOpt(this,(Var *)&init_expr.size_,&local_c0);
    Var::~Var(&local_c0);
    if (!bVar1) break;
    std::make_unique<wabt::VarExpr<(wabt::ExprType)36>,wabt::Var&>((Var *)local_d0);
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,std::default_delete<wabt::VarExpr<(wabt::ExprType)36>>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_c8,
               (unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)36>_>_>
                *)local_d0);
    intrusive_list<wabt::Expr>::push_back((intrusive_list<wabt::Expr> *)local_78,&local_c8);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_c8);
    std::
    unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)36>_>_>
    ::~unique_ptr((unique_ptr<wabt::VarExpr<(wabt::ExprType)36>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)36>_>_>
                   *)local_d0);
    std::
    vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>::
    push_back(out_list,(value_type *)local_78);
  }
  bVar1 = std::
          vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
          ::empty(out_list);
  intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_78);
  Var::~Var((Var *)&init_expr.size_);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool WastParser::ParseElemExprVarListOpt(ExprListVector* out_list) {
  WABT_TRACE(ParseElemExprVarListOpt);
  Var var;
  ExprList init_expr;
  while (ParseVarOpt(&var)) {
    init_expr.push_back(std::make_unique<RefFuncExpr>(var));
    out_list->push_back(std::move(init_expr));
  }
  return !out_list->empty();
}